

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

void __thiscall rengine::SDLBackend::SDLBackend(SDLBackend *this)

{
  int iVar1;
  ostream *poVar2;
  string local_40 [48];
  SDLBackend *local_10;
  SDLBackend *this_local;
  
  local_10 = this;
  Backend::Backend(&this->super_Backend);
  SurfaceBackendImpl::SurfaceBackendImpl(&this->super_SurfaceBackendImpl);
  (this->super_Backend)._vptr_Backend = (_func_int **)&PTR__SDLBackend_00145750;
  (this->super_SurfaceBackendImpl)._vptr_SurfaceBackendImpl =
       (_func_int **)&PTR__SDLBackend_001457d0;
  this->m_surface = (Surface *)0x0;
  this->m_window = (SDL_Window *)0x0;
  this->m_gl = (SDL_GLContext)0x0;
  this->m_renderRequested = false;
  iVar1 = SDL_Init(0x20);
  if (iVar1 < 0) {
    SDLBackend_die("Unable to initialize SDL");
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"I [");
  log_timestring_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2,"]: ");
  poVar2 = std::operator<<(poVar2,"SDLBackend: created...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

SDLBackend()
    {
        if (SDL_Init(SDL_INIT_VIDEO) < 0)
            SDLBackend_die("Unable to initialize SDL");
        logi << "SDLBackend: created..." << std::endl;
    }